

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_TwoAllocOneFreeOneLeakReverseOrder_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x20,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                                  ,0xfd);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0035b8d0;
  return this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, TwoAllocOneFreeOneLeakReverseOrder)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    char* mem2 = detector->allocMemory(defaultNewAllocator(), 12);
    detector->deallocMemory(defaultNewAllocator(), mem2);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_checking));
    CHECK(!output.contains("size: 12"));
    CHECK(output.contains("size: 4"));
    PlatformSpecificFree(mem);
}